

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O2

Chunk * __thiscall Mempool::alloc_chunk(Mempool *this,int n)

{
  Chunk *pCVar1;
  uint size;
  mapped_type *ppCVar2;
  mapped_type this_00;
  char *__format;
  undefined8 uStack_40;
  uint local_2c;
  
  local_2c = 0x1000;
  while( true ) {
    if (0x400000 < local_2c) {
      return (Chunk *)0x0;
    }
    if (n <= (int)local_2c) break;
    local_2c = local_2c << 2;
  }
  std::mutex::lock(&this->mp_mutex);
  ppCVar2 = std::__detail::
            _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,(key_type *)&local_2c);
  size = local_2c;
  if (*ppCVar2 != (mapped_type)0x0) {
    ppCVar2 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,(key_type *)&local_2c);
    this_00 = *ppCVar2;
    pCVar1 = this_00->next;
    ppCVar2 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,(key_type *)&local_2c);
    *ppCVar2 = pCVar1;
    this_00->next = (Chunk *)0x0;
    this->mp_left_size_kb = this->mp_left_size_kb - (long)((int)local_2c / 0x400);
LAB_0010ed40:
    pthread_mutex_unlock((pthread_mutex_t *)&this->mp_mutex);
    return this_00;
  }
  if ((long)((int)local_2c / 0x400) + this->mp_total_size_kb < 0x400000) {
    this_00 = (mapped_type)operator_new(0x20,(nothrow_t *)&std::nothrow);
    if (this_00 != (Chunk *)0x0) {
      Chunk::Chunk(this_00,size);
      this->mp_total_size_kb = this->mp_total_size_kb + (long)((int)local_2c / 0x400);
      goto LAB_0010ed40;
    }
    if (pr_level < 0) goto LAB_0010eda8;
    __format = "[%-5s][%s:%d] new chunk error\n";
    uStack_40 = 0x41;
  }
  else {
    if (pr_level < 0) goto LAB_0010eda8;
    __format = "[%-5s][%s:%d] beyond the limit size of memory!\n";
    uStack_40 = 0x3b;
  }
  printf(__format,"error","alloc_chunk",uStack_40);
LAB_0010eda8:
  exit(1);
}

Assistant:

Chunk *Mempool::alloc_chunk(int n) 
{
    int index;
    bool found = false;
    for(index = mLow; index <= mUp; index = index * MEM_CAP_MULTI_POWER)
    {
        if(n <= index)
        {
            found = true;
            break;
        }
    }

    if(!found)
    {
        return nullptr;
    }

    lock_guard<mutex> lck(mp_mutex);
    if (mp_pool[index] == nullptr) {
        if (mp_total_size_kb + index/1024 >= MAX_POOL_SIZE) {
            PR_ERROR("beyond the limit size of memory!\n");
            exit(1);
        }

        Chunk *new_buf = new (std::nothrow) Chunk(index);
        if (new_buf == nullptr) {
            PR_ERROR("new chunk error\n");
            exit(1);
        }
        mp_total_size_kb += index/1024;
        return new_buf;
    }

    Chunk *target = mp_pool[index];
    mp_pool[index] = target->next;
    target->next = nullptr;
    mp_left_size_kb -= index/1024;

    return target;
}